

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int IDisk::AddByteToTrack(uchar *track,uint index,uchar byte,int size,uchar previous_bit)

{
  int iVar1;
  int local_2c;
  uchar c;
  int i;
  uchar previous_bit_local;
  int size_local;
  uchar byte_local;
  uint index_local;
  uchar *track_local;
  
  if (track == (uchar *)0x0) {
    track_local._4_4_ = index + size * 2;
  }
  else {
    c = previous_bit;
    if (index != 0) {
      c = track[index - 1];
    }
    size_local = index;
    for (local_2c = 0; iVar1 = size_local, local_2c < size; local_2c = local_2c + 1) {
      if (((byte)((int)(uint)byte >> (7U - (char)local_2c & 0x1f)) & 1) == 1) {
        track[(uint)size_local] = '\0';
        track[size_local + 1] = '\x01';
      }
      else {
        track[(uint)size_local] = c == '\0';
        track[size_local + 1] = '\0';
      }
      size_local = size_local + 1;
      c = track[(uint)size_local];
      size_local = iVar1 + 2;
    }
    track_local._4_4_ = size_local;
  }
  return track_local._4_4_;
}

Assistant:

int IDisk::AddByteToTrack(unsigned char* track, unsigned int index, unsigned char byte, int size,
                          unsigned char previous_bit)
{
   if (track == nullptr)
      return index + (size * 2);

   if (index > 0)
   {
      previous_bit = track[index - 1];
   }

   for (int i = 0; i < size; i++)
   {
      // Get bit
      unsigned char c = ((byte >> (7 - i)) & 0x01);

      if (c == 1)
      {
         track[index++] = 0;
         track[index] = 1;
      }
      else
      {
         track[index++] = (previous_bit == 0) ? 1 : 0;
         track[index] = 0;
      }

      previous_bit = track[index++];
   }
   return index;
}